

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O1

void __thiscall
prometheus::detail::MetricsHandler::RemoveCollectable
          (MetricsHandler *this,weak_ptr<prometheus::Collectable> *collectable)

{
  mutex *__mutex;
  int iVar1;
  __weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pthread_mutex_t *__mutex_00;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  __first;
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  _Var6;
  bool bVar7;
  shared_ptr<prometheus::Collectable> locked;
  element_type **local_58;
  pthread_mutex_t *local_50;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  element_type **local_38;
  
  __mutex = &this->collectables_mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    pthread_mutex_unlock(local_50);
    _Unwind_Resume(uVar4);
  }
  local_40 = (collectable->super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = local_40->_M_use_count;
    do {
      if (iVar3 == 0) {
        local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = local_40->_M_use_count;
      bVar7 = iVar3 == iVar1;
      if (bVar7) {
        local_40->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar7);
  }
  if (local_40 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar7 = true;
  }
  else {
    bVar7 = local_40->_M_use_count == 0;
  }
  if (bVar7) {
    local_48 = (element_type *)0x0;
  }
  else {
    local_48 = (collectable->super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
  }
  local_58 = &local_48;
  _Var6._M_current =
       (this->collectables_).
       super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  p_Var2 = &((this->collectables_).
             super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>;
  lVar5 = (long)p_Var2 - (long)_Var6._M_current >> 6;
  local_50 = (pthread_mutex_t *)__mutex;
  local_38 = local_58;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_58,_Var6);
      __first._M_current = _Var6._M_current;
      if (bVar7) goto LAB_0011bd82;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_58,_Var6._M_current + 1);
      __first._M_current = _Var6._M_current + 1;
      if (bVar7) goto LAB_0011bd82;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_58,_Var6._M_current + 2);
      __first._M_current = _Var6._M_current + 2;
      if (bVar7) goto LAB_0011bd82;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_58,_Var6._M_current + 3);
      __first._M_current = _Var6._M_current + 3;
      if (bVar7) goto LAB_0011bd82;
      _Var6._M_current = _Var6._M_current + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)p_Var2 - (long)_Var6._M_current >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var2;
      if ((lVar5 != 3) ||
         (bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
                  ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                                *)&local_58,_Var6), __first._M_current = _Var6._M_current, bVar7))
      goto LAB_0011bd82;
      _Var6._M_current = _Var6._M_current + 1;
    }
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_58,_Var6);
    __first._M_current = _Var6._M_current;
    if (bVar7) goto LAB_0011bd82;
    _Var6._M_current = _Var6._M_current + 1;
  }
  bVar7 = __gnu_cxx::__ops::
          _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
          ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                        *)&local_58,_Var6);
  __first._M_current = _Var6._M_current;
  if (!bVar7) {
    __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var2;
  }
LAB_0011bd82:
  _Var6._M_current =
       (weak_ptr<prometheus::Collectable> *)
       (&(__first._M_current)->super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>
       + 1);
  if ((__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *)_Var6._M_current != p_Var2
      && &(__first._M_current)->
          super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> != p_Var2) {
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_38,_Var6);
      if (!bVar7) {
        std::__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__first._M_current)->
                    super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>,
                   &(_Var6._M_current)->
                    super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>);
        __first._M_current =
             (weak_ptr<prometheus::Collectable> *)
             (&(__first._M_current)->
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + 1);
      }
      _Var6._M_current = _Var6._M_current + 1;
    } while (&(_Var6._M_current)->
              super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> != p_Var2);
  }
  std::
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ::_M_erase(&this->collectables_,(iterator)__first._M_current,
             (this->collectables_).
             super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __mutex_00 = local_50;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  pthread_mutex_unlock(__mutex_00);
  return;
}

Assistant:

void MetricsHandler::RemoveCollectable(
    const std::weak_ptr<Collectable>& collectable) {
  std::lock_guard<std::mutex> lock{collectables_mutex_};

  auto locked = collectable.lock();
  auto same_pointer = [&locked](const std::weak_ptr<Collectable>& candidate) {
    return locked == candidate.lock();
  };

  collectables_.erase(std::remove_if(std::begin(collectables_),
                                     std::end(collectables_), same_pointer),
                      std::end(collectables_));
}